

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cc
# Opt level: O1

Status __thiscall
leveldb::DoWriteStringToFile(leveldb *this,Env *env,Slice *data,string *fname,bool should_sync)

{
  void *pvVar1;
  WritableFile *file;
  long *local_48;
  void *local_40;
  void *local_38;
  
  (*env->_vptr_Env[4])(this,env,fname,&local_48);
  if (*(long *)this == 0) {
    (**(code **)(*local_48 + 0x10))(&local_40,local_48,data);
    pvVar1 = *(void **)this;
    *(void **)this = local_40;
    local_40 = pvVar1;
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
    if (should_sync && *(long *)this == 0) {
      (**(code **)(*local_48 + 0x28))(&local_40);
      pvVar1 = *(void **)this;
      *(void **)this = local_40;
      local_40 = pvVar1;
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
      }
    }
    if (*(long *)this == 0) {
      (**(code **)(*local_48 + 0x18))(&local_40);
      pvVar1 = *(void **)this;
      *(void **)this = local_40;
      local_40 = pvVar1;
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
      }
    }
    if (local_48 != (long *)0x0) {
      (**(code **)(*local_48 + 8))();
    }
    if (*(long *)this != 0) {
      (*env->_vptr_Env[8])(&local_38,env,fname);
      if (local_38 != (void *)0x0) {
        operator_delete__(local_38);
      }
    }
  }
  return (Status)(char *)this;
}

Assistant:

static Status DoWriteStringToFile(Env* env, const Slice& data,
                                  const std::string& fname, bool should_sync) {
  WritableFile* file;
  Status s = env->NewWritableFile(fname, &file);
  if (!s.ok()) {
    return s;
  }
  s = file->Append(data);
  if (s.ok() && should_sync) {
    s = file->Sync();
  }
  if (s.ok()) {
    s = file->Close();
  }
  delete file;  // Will auto-close if we did not close above
  if (!s.ok()) {
    env->DeleteFile(fname);
  }
  return s;
}